

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vao.cpp
# Opt level: O0

void anon_unknown.dwarf_111c0e::upload_attribute
               (GLuint VAO,GLint dimension,GLint *data,int num_vertices,GLint location)

{
  uint local_24;
  uint local_20;
  GLuint VBO;
  GLint location_local;
  int num_vertices_local;
  GLint *data_local;
  GLint dimension_local;
  GLuint VAO_local;
  
  local_20 = location;
  VBO = num_vertices;
  _location_local = data;
  data_local._0_4_ = dimension;
  data_local._4_4_ = VAO;
  if (location < 0) {
    std::operator<<((ostream *)&std::cerr,
                    "WARNING: Not uploading attribute with a negative location. The vertex shader doesn\'t declare or use this attribute. You need to re-launch if your set of declared or used vertex attributes changes.\n"
                   );
  }
  else {
    if (num_vertices < 1) {
      __assert_fail("num_vertices > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/yig[P]graphics101-pipeline/src/vao.cpp"
                    ,0x3c,
                    "void (anonymous namespace)::upload_attribute(GLuint, GLint, const GLint *, int, GLint)"
                   );
    }
    if (data == (GLint *)0x0) {
      __assert_fail("data",
                    "/workspace/llm4binary/github/license_c_cmakelists/yig[P]graphics101-pipeline/src/vao.cpp"
                    ,0x3d,
                    "void (anonymous namespace)::upload_attribute(GLuint, GLint, const GLint *, int, GLint)"
                   );
    }
    (*gl3wProcs.ptr[0x1a])((ulong)VAO);
    (*gl3wProcs.ptr[0xab])(1,&local_24);
    (*gl3wProcs.ptr[8])(0x8892,(ulong)local_24);
    (*gl3wProcs.ptr[0x28])
              (0x8892,(long)(int)(uint)data_local * 4 * (long)(int)VBO,_location_local,0x88e4);
    (*gl3wProcs.ptr[0x277])((ulong)local_20,(ulong)(uint)data_local,0x1404,0,0);
    (*gl3wProcs.ptr[0x98])((ulong)local_20);
    (*gl3wProcs.ptr[0x1a])(0);
    (*gl3wProcs.ptr[8])(0x8892,0);
    (*gl3wProcs.ptr[0x6a])(1,&local_24);
  }
  return;
}

Assistant:

void upload_attribute( GLuint VAO, GLint dimension, const GLint* data, int num_vertices, GLint location )
{
    if( location < 0 ) {
        std::cerr << "WARNING: Not uploading attribute with a negative location. The vertex shader doesn't declare or use this attribute. You need to re-launch if your set of declared or used vertex attributes changes.\n";
        return;
    }
    
    assert( num_vertices > 0 );
    assert( data );
    
    // Bind the Vertex Array Object
	glBindVertexArray( VAO );
	
    // Generate a GPU buffer
	GLuint VBO;
	glGenBuffers( 1, &VBO );
	
	// Bind the buffer
	glBindBuffer( GL_ARRAY_BUFFER, VBO );
	// Upload the data
    glBufferData(
        GL_ARRAY_BUFFER,
        sizeof(GLint)*dimension*num_vertices,
        data,
        GL_STATIC_DRAW
        );
	
	// Attach the data to the given attribute ID
	glVertexAttribIPointer( location, dimension, GL_INT, 0, 0 );
    glEnableVertexAttribArray( location );
    
    // Unbind so we can delete the attribute buffer.
    glBindVertexArray( 0 );
    glBindBuffer( GL_ARRAY_BUFFER, 0 );
    // Delete the attribute buffer. This won't actually delete it until we delete the VAO.
    glDeleteBuffers( 1, &VBO );
}